

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_BoyerMooreState.h
# Opt level: O1

void __thiscall
axl::sl::BoyerMooreStateBase<char>::advance<false>
          (BoyerMooreStateBase<char> *this,size_t i,char *p,size_t length)

{
  ulong uVar1;
  
  this->m_offset = this->m_offset + i;
  uVar1 = (this->m_tail).m_length;
  if (uVar1 < i || uVar1 - i == 0) {
    length = length - (i - uVar1);
    (this->m_tail).m_front = 0;
    (this->m_tail).m_back = 0;
    (this->m_tail).m_length = 0;
    p = p + (i - uVar1);
  }
  else {
    (this->m_tail).m_front =
         (i + (this->m_tail).m_front) %
         (this->m_tail).m_buffer.super_ArrayRef<char,_axl::sl::ArrayDetails<char>_>.m_count;
    (this->m_tail).m_length = uVar1 - i;
  }
  CircularBufferBase<char>::writeBack(&this->m_tail,p,length);
  return;
}

Assistant:

void
	advance(
		size_t i,
		const C* p,
		size_t length
	) {
		m_offset += i;

		size_t tailLength = m_tail.getDataLength();
		if (i >= tailLength) {
			i -= tailLength;
			size_t copyLength = length - i;
			m_tail.clear();
			size_t result = m_tail.write(
				IsReverse ?
					p + length - copyLength - i :
					p + i,
				copyLength
			);
			ASSERT(result == copyLength);
		} else if (IsReverse) {
			m_tail.dropBack(i);
			size_t result = m_tail.writeFront(p, length);
			ASSERT(result == length);
		} else {
			m_tail.dropFront(i);
			size_t result = m_tail.writeBack(p, length);
			ASSERT(result == length);
		}
	}